

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

ssize_t __thiscall
booster::aio::stream_socket::write(stream_socket *this,int __fd,void *__buf,size_t __n)

{
  pointer peVar1;
  size_t n;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  long lVar3;
  buffer_impl<const_char_*> local_98;
  buffer_impl<const_char_*> local_60;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  local_98.entry_.size = puVar2[2];
  local_98._0_8_ = *puVar2;
  local_98.entry_.ptr = (char *)puVar2[1];
  std::
  vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ::vector(&local_98.vec_,
           (vector<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
            *)(puVar2 + 3));
  if (local_98.size_ == 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      n = write_some(this,(const_buffer *)&local_98,(error_code *)__buf);
      lVar3 = lVar3 + n;
      if (*__buf != 0) break;
      details::advance<booster::aio::const_buffer>
                ((const_buffer *)&local_60,(const_buffer *)&local_98,n);
      peVar1 = local_98.vec_.
               super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_98.entry_.size = local_60.entry_.size;
      local_98.size_ = local_60.size_;
      local_98._4_4_ = local_60._4_4_;
      local_98.entry_.ptr = local_60.entry_.ptr;
      local_98.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_60.vec_.
           super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_98.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_60.vec_.
           super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_98.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_60.vec_.
           super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_60.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_60.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_60.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((peVar1 != (pointer)0x0) &&
         (operator_delete(peVar1),
         local_60.vec_.
         super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_60.vec_.
                        super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    } while (local_98.size_ != 0);
  }
  if (local_98.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.vec_.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return lVar3;
}

Assistant:

size_t stream_socket::write(const_buffer const &buffer,system::error_code &e)
{
	const_buffer tmp = buffer;
	size_t count = 0;
	while(!tmp.empty()) {
		size_t n = write_some(tmp,e);
		count+=n;
		if(e) return count;
		tmp+=n;
	}
	return count;
}